

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O2

value_type __thiscall
jsoncons::jsonpath::detail::
ends_with_function<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
evaluate(ends_with_function<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
         *this,vector<jsoncons::jsonpath::parameter<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
               *args,error_code *ec)

{
  char *pcVar1;
  long lVar2;
  bool bVar3;
  ulong uVar4;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar5;
  undefined1 uVar6;
  error_code *in_RCX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar7;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> __x;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> __y;
  value_type vVar8;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> arg1;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> arg0;
  type sv0;
  
  pcVar1 = *(char **)ec;
  if ((pointer)(((long)ec->_M_cat - (long)pcVar1) / 0x18) !=
      (args->
      super__Vector_base<jsoncons::jsonpath::parameter<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    std::error_code::operator=(in_RCX,invalid_arity);
    pbVar5 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::null();
    basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::uninitialized_copy
              ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,pbVar5);
    uVar7 = extraout_RDX;
    goto LAB_0033213b;
  }
  if (*pcVar1 == '\0') {
    pbVar5 = *(basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> **)(pcVar1 + 8);
  }
  else {
    pbVar5 = (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)(pcVar1 + 8);
  }
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::uninitialized_copy
            (&arg0,pbVar5);
  bVar3 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::is_string(&arg0);
  if (bVar3) {
    lVar2 = *(long *)ec;
    if (*(char *)(lVar2 + 0x18) == '\0') {
      pbVar5 = *(basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> **)
                (lVar2 + 0x20);
    }
    else {
      pbVar5 = (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)(lVar2 + 0x20)
      ;
    }
    basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::uninitialized_copy
              (&arg1,pbVar5);
    bVar3 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::is_string(&arg1);
    if (bVar3) {
      sv0 = json_type_traits<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_void>
            ::as(&arg0);
      uVar4 = sv0._M_len;
      __x = json_type_traits<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_void>
            ::as(&arg1);
      if (uVar4 < __x._M_len) {
LAB_00332100:
        uVar6 = 0;
      }
      else {
        __y = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::substr
                        (&sv0,uVar4 - __x._M_len,0xffffffffffffffff);
        bVar3 = std::operator==(__x,__y);
        uVar6 = 1;
        if (!bVar3) goto LAB_00332100;
      }
      *(undefined2 *)
       &(this->
        super_function_base<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
        )._vptr_function_base = 1;
      *(undefined1 *)
       ((long)&(this->
               super_function_base<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
               )._vptr_function_base + 2) = uVar6;
    }
    else {
      std::error_code::operator=(in_RCX,invalid_type);
      pbVar5 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::null();
      basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::uninitialized_copy
                ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,pbVar5)
      ;
    }
    basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::~basic_json(&arg1);
  }
  else {
    std::error_code::operator=(in_RCX,invalid_type);
    pbVar5 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::null();
    basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::uninitialized_copy
              ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,pbVar5);
  }
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::~basic_json(&arg0);
  uVar7 = extraout_RDX_00;
LAB_0033213b:
  vVar8.field_0.int64_.val_ = uVar7;
  vVar8.field_0._0_8_ = this;
  return (value_type)vVar8.field_0;
}

Assistant:

value_type evaluate(const std::vector<parameter_type>& args, 
            std::error_code& ec) const override
        {
            if (args.size() != *this->arity())
            {
                ec = jsonpath_errc::invalid_arity;
                return value_type::null();
            }

            auto arg0= args[0].value();
            if (!arg0.is_string())
            {
                ec = jsonpath_errc::invalid_type;
                return value_type::null();
            }

            auto arg1= args[1].value();
            if (!arg1.is_string())
            {
                ec = jsonpath_errc::invalid_type;
                return value_type::null();
            }

            auto sv0 = arg0.template as<string_view_type>();
            auto sv1 = arg1.template as<string_view_type>();

            if (sv1.length() <= sv0.length() && sv1 == sv0.substr(sv0.length() - sv1.length()))
            {
                return value_type(true, semantic_tag::none);
            }
            return value_type(false, semantic_tag::none);
        }